

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * tokenExpr(Parse *pParse,int op,Token t)

{
  long lVar1;
  uint in_ECX;
  void *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  Expr *p;
  Token *in_stack_ffffffffffffffc0;
  sqlite3 *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  Expr *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (Expr *)sqlite3DbMallocRawNN(in_stack_ffffffffffffffc8,(u64)in_stack_ffffffffffffffc0);
  if (local_20 != (Expr *)0x0) {
    local_20->op = (u8)in_ESI;
    local_20->affExpr = '\0';
    local_20->flags = 0x800000;
    local_20->pRight = (Expr *)0x0;
    local_20->pLeft = (Expr *)0x0;
    local_20->pAggInfo = (AggInfo *)0x0;
    memset(&local_20->x,0,8);
    memset(&local_20->y,0,8);
    local_20->op2 = '\0';
    local_20->iTable = 0;
    local_20->iColumn = 0;
    (local_20->u).zToken = (char *)(local_20 + 1);
    memcpy((local_20->u).zToken,in_RDX,(ulong)in_ECX);
    (local_20->u).zToken[in_ECX] = '\0';
    (local_20->w).iJoin = (int)in_RDX - (int)*(undefined8 *)(in_RDI + 0x158);
    if ((""[(byte)*(local_20->u).zToken] & 0x80) != 0) {
      sqlite3DequoteExpr((Expr *)0x1ae80a);
    }
    local_20->nHeight = 1;
    if (1 < *(byte *)(in_RDI + 0x134)) {
      local_20 = (Expr *)sqlite3RenameTokenMap
                                   ((Parse *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),local_20,
                                    in_stack_ffffffffffffffc0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

static Expr *tokenExpr(Parse *pParse, int op, Token t){
    Expr *p = sqlite3DbMallocRawNN(pParse->db, sizeof(Expr)+t.n+1);
    if( p ){
      /* memset(p, 0, sizeof(Expr)); */
      p->op = (u8)op;
      p->affExpr = 0;
      p->flags = EP_Leaf;
      ExprClearVVAProperties(p);
      /* p->iAgg = -1; // Not required */
      p->pLeft = p->pRight = 0;
      p->pAggInfo = 0;
      memset(&p->x, 0, sizeof(p->x));
      memset(&p->y, 0, sizeof(p->y));
      p->op2 = 0;
      p->iTable = 0;
      p->iColumn = 0;
      p->u.zToken = (char*)&p[1];
      memcpy(p->u.zToken, t.z, t.n);
      p->u.zToken[t.n] = 0;
      p->w.iOfst = (int)(t.z - pParse->zTail);
      if( sqlite3Isquote(p->u.zToken[0]) ){
        sqlite3DequoteExpr(p);
      }
#if SQLITE_MAX_EXPR_DEPTH>0
      p->nHeight = 1;
#endif
      if( IN_RENAME_OBJECT ){
        return (Expr*)sqlite3RenameTokenMap(pParse, (void*)p, &t);
      }
    }
    return p;
  }